

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
::int_writer<char,_fmt::v5::basic_format_specs<char>_>::on_num
          (int_writer<char,_fmt::v5::basic_format_specs<char>_> *this)

{
  num_writer f;
  char cVar1;
  int iVar2;
  string_view prefix;
  locale_ref in_stack_ffffffffffffffd8;
  undefined4 local_18;
  
  iVar2 = internal::count_digits(this->abs_value);
  cVar1 = internal::thousands_sep_impl<char>(in_stack_ffffffffffffffd8);
  iVar2 = iVar2 + (iVar2 + -1) / 3;
  local_18 = CONCAT31(local_18._1_3_,cVar1);
  f.size = iVar2;
  f.abs_value = this->abs_value;
  f._8_4_ = local_18;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
  ::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::num_writer>
            ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
              *)this->writer,iVar2,prefix,this->spec,f);
  return;
}

Assistant:

void on_num() {
      int num_digits = internal::count_digits(abs_value);
      char_type sep = internal::thousands_sep<char_type>(writer.locale_);
      int size = num_digits + SEP_SIZE * ((num_digits - 1) / 3);
      writer.write_int(size, get_prefix(), spec,
                       num_writer{abs_value, size, sep});
    }